

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

int32_t google::protobuf::internal::ReadVarintZigZag32(char **p)

{
  int32_t iVar1;
  char *pcVar2;
  uint32_t local_18 [2];
  uint64_t tmp;
  char **p_local;
  
  tmp = (uint64_t)p;
  pcVar2 = VarintParse<unsigned_long>(*p,(unsigned_long *)local_18);
  *(char **)tmp = pcVar2;
  iVar1 = WireFormatLite::ZigZagDecode32(local_18[0]);
  return iVar1;
}

Assistant:

inline int32_t ReadVarintZigZag32(const char** p) {
  uint64_t tmp;
  *p = VarintParse(*p, &tmp);
  return WireFormatLite::ZigZagDecode32(static_cast<uint32_t>(tmp));
}